

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanNotUTF8(UnicodeSetStringSpan *this,uint8_t *s,int32_t length)

{
  int length_00;
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  int length_01;
  uint8_t *puStack_50;
  int32_t length8;
  uint8_t *s8;
  uint8_t *puStack_40;
  int32_t cpLength;
  uint8_t *spanUTF8Lengths;
  int local_30;
  int32_t stringsLength;
  int32_t i;
  int32_t rest;
  int32_t pos;
  int32_t length_local;
  uint8_t *s_local;
  UnicodeSetStringSpan *this_local;
  
  i = 0;
  iVar2 = UVector::size(this->strings);
  puStack_40 = this->spanLengths;
  stringsLength = length;
  if (this->all != '\0') {
    puStack_40 = puStack_40 + (iVar2 << 1);
  }
  while( true ) {
    iVar3 = UnicodeSet::spanUTF8
                      (this->pSpanNotSet,(char *)(s + i),stringsLength,USET_SPAN_NOT_CONTAINED);
    if (iVar3 == stringsLength) {
      return length;
    }
    iVar4 = iVar3 + i;
    length_01 = stringsLength - iVar3;
    iVar3 = spanOneUTF8(&this->spanSet,s + iVar4,length_01);
    if (0 < iVar3) break;
    puStack_50 = this->utf8;
    for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
      length_00 = this->utf8Lengths[local_30];
      if ((((length_00 != 0) && (puStack_40[local_30] != 0xff)) && (length_00 <= length_01)) &&
         (UVar1 = matches8(s + iVar4,puStack_50,length_00), UVar1 != '\0')) {
        return iVar4;
      }
      puStack_50 = puStack_50 + length_00;
    }
    i = iVar4 - iVar3;
    stringsLength = iVar3 + length_01;
    if (stringsLength == 0) {
      return length;
    }
  }
  return iVar4;
}

Assistant:

int32_t UnicodeSetStringSpan::spanNotUTF8(const uint8_t *s, int32_t length) const {
    int32_t pos=0, rest=length;
    int32_t i, stringsLength=strings.size();
    uint8_t *spanUTF8Lengths=spanLengths;
    if(all) {
        spanUTF8Lengths+=2*stringsLength;
    }
    do {
        // Span until we find a code point from the set,
        // or a code point that starts or ends some string.
        i=pSpanNotSet->spanUTF8((const char *)s+pos, rest, USET_SPAN_NOT_CONTAINED);
        if(i==rest) {
            return length;  // Reached the end of the string.
        }
        pos+=i;
        rest-=i;

        // Check whether the current code point is in the original set,
        // without the string starts and ends.
        int32_t cpLength=spanOneUTF8(spanSet, s+pos, rest);
        if(cpLength>0) {
            return pos;  // There is a set element at pos.
        }

        // Try to match the strings at pos.
        const uint8_t *s8=utf8;
        int32_t length8;
        for(i=0; i<stringsLength; ++i) {
            length8=utf8Lengths[i];
            // ALL_CP_CONTAINED: Irrelevant string.
            if(length8!=0 && spanUTF8Lengths[i]!=ALL_CP_CONTAINED && length8<=rest && matches8(s+pos, s8, length8)) {
                return pos;  // There is a set element at pos.
            }
            s8+=length8;
        }

        // The span(while not contained) ended on a string start/end which is
        // not in the original set. Skip this code point and continue.
        // cpLength<0
        pos-=cpLength;
        rest+=cpLength;
    } while(rest!=0);
    return length;  // Reached the end of the string.
}